

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void ws_dial_cancel(nni_aio *aio,void *arg,int rv)

{
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if (*(nni_aio **)((long)arg + 0x9e0) == aio) {
    nni_aio_abort((nni_aio *)((long)arg + 0x818),rv);
    nni_aio_abort((nni_aio *)((long)arg + 0x650),rv);
    *(undefined8 *)((long)arg + 0x9e0) = 0;
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return;
}

Assistant:

static void
ws_dial_cancel(nni_aio *aio, void *arg, int rv)
{
	nni_ws *ws = arg;

	nni_mtx_lock(&ws->mtx);
	if (aio == ws->useraio) {
		nni_aio_abort(&ws->connaio, rv);
		nni_aio_abort(&ws->httpaio, rv);
		ws->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&ws->mtx);
}